

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tokenizer.cc
# Opt level: O2

void __thiscall
onmt::TokensBuilder::append
          (TokensBuilder *this,
          vector<onmt::unicode::CharInfo,_std::allocator<onmt::unicode::CharInfo>_> *chars,
          size_t begin,size_t end)

{
  long lVar1;
  size_t i;
  
  lVar1 = begin << 5;
  for (; begin < end; begin = begin + 1) {
    append(this,(CharInfo *)
                ((long)&((chars->
                         super__Vector_base<onmt::unicode::CharInfo,_std::allocator<onmt::unicode::CharInfo>_>
                         )._M_impl.super__Vector_impl_data._M_start)->data + lVar1));
    lVar1 = lVar1 + 0x20;
  }
  return;
}

Assistant:

void append(const std::vector<unicode::CharInfo>& chars,
                const size_t begin,
                const size_t end)
    {
      for (size_t i = begin; i < end; ++i)
        append(chars[i]);
    }